

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blk_sse_sum_avx2.c
# Opt level: O1

void aom_get_blk_sse_sum_avx2(int16_t *data,int stride,int bw,int bh,int *x_sum,int64_t *x2_sum)

{
  undefined1 (*pauVar1) [32];
  long lVar2;
  ulong uVar3;
  undefined1 (*pauVar4) [32];
  int iVar5;
  int64_t iVar6;
  undefined1 auVar7 [32];
  undefined1 auVar8 [64];
  undefined1 auVar9 [32];
  undefined1 auVar10 [64];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [16];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [32];
  undefined1 auVar19 [16];
  
  *x_sum = 0;
  *x2_sum = 0;
  if ((bh & 3U) != 0) {
LAB_00383797:
    aom_get_blk_sse_sum_c(data,stride,bw,bh,x_sum,x2_sum);
    return;
  }
  if (bw < 0x10) {
    if (bw == 4) {
      iVar5 = bh >> 2;
      auVar9 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
      auVar10 = ZEXT1664((undefined1  [16])0x0);
      auVar15 = auVar10._0_32_;
      auVar8 = ZEXT1664((undefined1  [16])0x0);
      auVar7 = auVar8._0_32_;
      if (0 < iVar5) {
        auVar12._8_2_ = 1;
        auVar12._0_8_ = 0x1000100010001;
        auVar12._10_2_ = 1;
        auVar12._12_2_ = 1;
        auVar12._14_2_ = 1;
        auVar12._16_2_ = 1;
        auVar12._18_2_ = 1;
        auVar12._20_2_ = 1;
        auVar12._22_2_ = 1;
        auVar12._24_2_ = 1;
        auVar12._26_2_ = 1;
        auVar12._28_2_ = 1;
        auVar12._30_2_ = 1;
        do {
          auVar13._8_8_ = 0;
          auVar13._0_8_ = *(ulong *)((long)data + (long)stride * 2);
          auVar16._8_8_ = 0;
          auVar16._0_8_ = *(ulong *)data;
          auVar13 = vpunpcklqdq_avx(auVar16,auVar13);
          auVar17._8_8_ = 0;
          auVar17._0_8_ = *(ulong *)((long)data + (long)(stride * 3) * 2);
          auVar19._8_8_ = 0;
          auVar19._0_8_ = *(ulong *)((long)data + (long)(stride * 2) * 2);
          auVar16 = vpunpcklqdq_avx(auVar19,auVar17);
          auVar15._0_16_ = ZEXT116(0) * auVar16 + ZEXT116(1) * auVar13;
          auVar15._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar16;
          auVar7 = vpmaddwd_avx2(auVar15,auVar12);
          auVar7 = vpaddd_avx2(auVar7,auVar8._0_32_);
          auVar8 = ZEXT3264(auVar7);
          auVar15 = vpmaddwd_avx2(auVar15,auVar15);
          auVar15 = vpaddd_avx2(auVar15,auVar10._0_32_);
          auVar10 = ZEXT3264(auVar15);
          data = (int16_t *)((long)data + (long)(stride << 2) * 2);
          iVar5 = iVar5 + -1;
        } while (iVar5 != 0);
      }
    }
    else {
      if (bw != 8) goto LAB_00383797;
      iVar5 = bh >> 1;
      auVar9 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
      auVar10 = ZEXT1664((undefined1  [16])0x0);
      auVar15 = auVar10._0_32_;
      auVar8 = ZEXT1664((undefined1  [16])0x0);
      auVar7 = auVar8._0_32_;
      if (0 < iVar5) {
        auVar18._8_2_ = 1;
        auVar18._0_8_ = 0x1000100010001;
        auVar18._10_2_ = 1;
        auVar18._12_2_ = 1;
        auVar18._14_2_ = 1;
        auVar18._16_2_ = 1;
        auVar18._18_2_ = 1;
        auVar18._20_2_ = 1;
        auVar18._22_2_ = 1;
        auVar18._24_2_ = 1;
        auVar18._26_2_ = 1;
        auVar18._28_2_ = 1;
        auVar18._30_2_ = 1;
        do {
          auVar14._0_16_ =
               ZEXT116(0) * *(undefined1 (*) [16])(*(undefined1 (*) [16])data + (long)stride * 2) +
               ZEXT116(1) * *(undefined1 (*) [16])data;
          auVar14._16_16_ =
               ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
               ZEXT116(1) * *(undefined1 (*) [16])(*(undefined1 (*) [16])data + (long)stride * 2);
          auVar7 = vpmaddwd_avx2(auVar14,auVar18);
          auVar7 = vpaddd_avx2(auVar7,auVar8._0_32_);
          auVar8 = ZEXT3264(auVar7);
          auVar15 = vpmaddwd_avx2(auVar14,auVar14);
          auVar15 = vpaddd_avx2(auVar15,auVar10._0_32_);
          auVar10 = ZEXT3264(auVar15);
          data = (int16_t *)(*(undefined1 (*) [16])data + (long)(stride * 2) * 2);
          iVar5 = iVar5 + -1;
        } while (iVar5 != 0);
      }
    }
  }
  else {
    if ((bw != 0x10) && (bw != 0x20)) {
      if (bw != 0x40) goto LAB_00383797;
      if (bh < 0x21) {
        auVar8 = ZEXT1664((undefined1  [16])0x0);
        lVar2 = 0;
        auVar9._8_2_ = 1;
        auVar9._0_8_ = 0x1000100010001;
        auVar9._10_2_ = 1;
        auVar9._12_2_ = 1;
        auVar9._14_2_ = 1;
        auVar9._16_2_ = 1;
        auVar9._18_2_ = 1;
        auVar9._20_2_ = 1;
        auVar9._22_2_ = 1;
        auVar9._24_2_ = 1;
        auVar9._26_2_ = 1;
        auVar9._28_2_ = 1;
        auVar9._30_2_ = 1;
        auVar10 = ZEXT1664((undefined1  [16])0x0);
        do {
          pauVar1 = (undefined1 (*) [32])data;
          iVar5 = bh;
          if (0 < bh) {
            do {
              auVar7 = vlddqu_avx(*pauVar1);
              auVar15 = vpmaddwd_avx2(auVar7,auVar9);
              auVar15 = vpaddd_avx2(auVar15,auVar8._0_32_);
              auVar8 = ZEXT3264(auVar15);
              auVar7 = vpmaddwd_avx2(auVar7,auVar7);
              auVar7 = vpaddd_avx2(auVar7,auVar10._0_32_);
              auVar10 = ZEXT3264(auVar7);
              pauVar1 = (undefined1 (*) [32])(*pauVar1 + (long)stride * 2);
              iVar5 = iVar5 + -1;
            } while (iVar5 != 0);
          }
          lVar2 = lVar2 + 1;
          data = (int16_t *)((long)data + 0x20);
        } while (lVar2 != 4);
        auVar15 = vpunpckldq_avx2(auVar10._0_32_,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
        auVar7 = vpunpckhdq_avx2(auVar10._0_32_,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
        auVar7 = vpaddq_avx2(auVar15,auVar7);
        auVar13 = vphaddd_avx(auVar8._16_16_,auVar8._0_16_);
        auVar16 = vphaddd_avx(auVar13,auVar13);
        auVar13 = vpaddq_avx(auVar7._0_16_,auVar7._16_16_);
        auVar16 = vphaddd_avx(auVar16,auVar16);
        auVar17 = vpshufd_avx(auVar13,0xee);
        *x_sum = auVar16._0_4_;
        auVar13 = vpaddq_avx(auVar13,auVar17);
        iVar6 = auVar13._0_8_;
      }
      else {
        auVar10 = ZEXT1664((undefined1  [16])0x0);
        lVar2 = 0;
        auVar7._8_2_ = 1;
        auVar7._0_8_ = 0x1000100010001;
        auVar7._10_2_ = 1;
        auVar7._12_2_ = 1;
        auVar7._14_2_ = 1;
        auVar7._16_2_ = 1;
        auVar7._18_2_ = 1;
        auVar7._20_2_ = 1;
        auVar7._22_2_ = 1;
        auVar7._24_2_ = 1;
        auVar7._26_2_ = 1;
        auVar7._28_2_ = 1;
        auVar7._30_2_ = 1;
        auVar8 = ZEXT1664((undefined1  [16])0x0);
        pauVar1 = (undefined1 (*) [32])data;
        do {
          iVar5 = 0x20;
          pauVar4 = pauVar1;
          do {
            auVar15 = vlddqu_avx(*pauVar4);
            auVar9 = vpmaddwd_avx2(auVar15,auVar7);
            auVar9 = vpaddd_avx2(auVar9,auVar10._0_32_);
            auVar10 = ZEXT3264(auVar9);
            auVar15 = vpmaddwd_avx2(auVar15,auVar15);
            auVar15 = vpaddd_avx2(auVar15,auVar8._0_32_);
            auVar8 = ZEXT3264(auVar15);
            pauVar4 = (undefined1 (*) [32])(*pauVar4 + (long)stride * 2);
            iVar5 = iVar5 + -1;
          } while (iVar5 != 0);
          lVar2 = lVar2 + 1;
          pauVar1 = pauVar1 + 1;
        } while (lVar2 != 4);
        auVar8 = ZEXT1664((undefined1  [16])0x0);
        auVar12 = vpunpckldq_avx2(auVar15,auVar8._0_32_);
        auVar15 = vpunpckhdq_avx2(auVar15,auVar8._0_32_);
        auVar12 = vpaddq_avx2(auVar12,auVar15);
        auVar15 = vpermq_avx2(auVar9,0x4e);
        auVar15 = vpaddd_avx2(auVar15,auVar9);
        auVar18 = vpsrldq_avx2(auVar15,8);
        auVar15 = vpaddd_avx2(auVar15,auVar18);
        auVar13 = vpshufd_avx(auVar15._0_16_,0xe9);
        auVar15 = vpaddd_avx2(auVar15,ZEXT1632(auVar13));
        auVar13 = vphaddd_avx(auVar9._16_16_,auVar9._0_16_);
        auVar9 = vpermq_avx2(auVar12,0x4e);
        auVar9 = vpaddq_avx2(auVar12,auVar9);
        auVar13 = vphaddd_avx(auVar13,auVar13);
        auVar16 = vpshufd_avx(auVar9._0_16_,0xee);
        auVar13 = vphaddd_avx(auVar13,auVar13);
        auVar9 = vpaddq_avx2(auVar9,ZEXT1632(auVar16));
        *x_sum = auVar13._0_4_;
        *x2_sum = auVar9._0_8_;
        pauVar1 = (undefined1 (*) [32])(data + (stride << 5));
        lVar2 = 0;
        auVar10 = ZEXT1664((undefined1  [16])0x0);
        do {
          iVar5 = 0x20;
          pauVar4 = pauVar1;
          do {
            auVar12 = vlddqu_avx(*pauVar4);
            auVar18 = vpmaddwd_avx2(auVar12,auVar7);
            auVar18 = vpaddd_avx2(auVar18,auVar8._0_32_);
            auVar8 = ZEXT3264(auVar18);
            auVar12 = vpmaddwd_avx2(auVar12,auVar12);
            auVar12 = vpaddd_avx2(auVar12,auVar10._0_32_);
            auVar10 = ZEXT3264(auVar12);
            pauVar4 = (undefined1 (*) [32])(*pauVar4 + (long)stride * 2);
            iVar5 = iVar5 + -1;
          } while (iVar5 != 0);
          lVar2 = lVar2 + 1;
          pauVar1 = pauVar1 + 1;
        } while (lVar2 != 4);
        auVar14 = vpunpckldq_avx2(auVar12,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
        auVar7 = vpunpckhdq_avx2(auVar12,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
        auVar12 = vpaddq_avx2(auVar14,auVar7);
        auVar7 = vpaddd_avx2(ZEXT1632(auVar18._16_16_),auVar18);
        auVar13 = vpsrldq_avx(auVar7._0_16_,8);
        auVar13 = vpaddd_avx(auVar7._0_16_,auVar13);
        auVar13 = vphaddd_avx(auVar13,auVar13);
        auVar16 = vpaddq_avx(auVar12._0_16_,auVar12._16_16_);
        auVar17 = vpshufd_avx(auVar16,0xee);
        auVar13 = vpaddd_avx(auVar13,auVar15._0_16_);
        *x_sum = auVar13._0_4_;
        auVar13 = vpaddq_avx(auVar16,auVar9._0_16_);
        auVar13 = vpaddq_avx(auVar13,auVar17);
        iVar6 = auVar13._0_8_;
      }
      goto LAB_003839bc;
    }
    auVar9 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
    auVar10 = ZEXT1664((undefined1  [16])0x0);
    auVar15 = auVar10._0_32_;
    auVar8 = ZEXT1664((undefined1  [16])0x0);
    auVar7 = auVar8._0_32_;
    if (0 < bw >> 4) {
      uVar3 = 0;
      auVar11._8_2_ = 1;
      auVar11._0_8_ = 0x1000100010001;
      auVar11._10_2_ = 1;
      auVar11._12_2_ = 1;
      auVar11._14_2_ = 1;
      auVar11._16_2_ = 1;
      auVar11._18_2_ = 1;
      auVar11._20_2_ = 1;
      auVar11._22_2_ = 1;
      auVar11._24_2_ = 1;
      auVar11._26_2_ = 1;
      auVar11._28_2_ = 1;
      auVar11._30_2_ = 1;
      do {
        pauVar1 = (undefined1 (*) [32])data;
        iVar5 = bh;
        if (0 < bh) {
          do {
            auVar7 = vlddqu_avx(*pauVar1);
            auVar15 = vpmaddwd_avx2(auVar7,auVar11);
            auVar15 = vpaddd_avx2(auVar15,auVar8._0_32_);
            auVar8 = ZEXT3264(auVar15);
            auVar7 = vpmaddwd_avx2(auVar7,auVar7);
            auVar7 = vpaddd_avx2(auVar7,auVar10._0_32_);
            auVar10 = ZEXT3264(auVar7);
            pauVar1 = (undefined1 (*) [32])(*pauVar1 + (long)stride * 2);
            iVar5 = iVar5 + -1;
          } while (iVar5 != 0);
        }
        auVar15 = auVar10._0_32_;
        auVar7 = auVar8._0_32_;
        uVar3 = uVar3 + 1;
        data = (int16_t *)((long)data + 0x20);
      } while (uVar3 != (uint)(bw >> 4));
    }
  }
  auVar12 = vpunpckldq_avx2(auVar15,auVar9);
  auVar15 = vpunpckhdq_avx2(auVar15,auVar9);
  auVar15 = vpaddq_avx2(auVar12,auVar15);
  auVar13 = vphaddd_avx(auVar7._16_16_,auVar7._0_16_);
  auVar16 = vphaddd_avx(auVar13,auVar13);
  auVar13 = vpaddq_avx(auVar15._0_16_,auVar15._16_16_);
  auVar16 = vphaddd_avx(auVar16,auVar16);
  auVar17 = vpshufd_avx(auVar13,0xee);
  *x_sum = auVar16._0_4_;
  auVar13 = vpaddq_avx(auVar13,auVar17);
  iVar6 = auVar13._0_8_;
LAB_003839bc:
  *x2_sum = iVar6;
  return;
}

Assistant:

void aom_get_blk_sse_sum_avx2(const int16_t *data, int stride, int bw, int bh,
                              int *x_sum, int64_t *x2_sum) {
  *x_sum = 0;
  *x2_sum = 0;

  if ((bh & 3) == 0) {
    switch (bw) {
        // For smaller block widths, compute multiple rows simultaneously.
      case 4: sse_sum_wd4_avx2(data, stride, bh, x_sum, x2_sum); break;
      case 8: sse_sum_wd8_avx2(data, stride, bh, x_sum, x2_sum); break;
      case 16:
      case 32:
        sse_sum_wd16_avx2(data, stride, bh, x_sum, x2_sum, bw >> 4);
        break;
      case 64:
        // 32-bit variables will overflow for 64 rows at a single time, so
        // compute 32 rows at a time.
        if (bh <= 32) {
          sse_sum_wd16_avx2(data, stride, bh, x_sum, x2_sum, bw >> 4);
        } else {
          sse_sum_wd16_avx2(data, stride, 32, x_sum, x2_sum, bw >> 4);
          sse_sum_wd16_avx2(data + 32 * stride, stride, 32, x_sum, x2_sum,
                            bw >> 4);
        }
        break;

      default: aom_get_blk_sse_sum_c(data, stride, bw, bh, x_sum, x2_sum);
    }
  } else {
    aom_get_blk_sse_sum_c(data, stride, bw, bh, x_sum, x2_sum);
  }
}